

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportBaseDirWrapper.cpp
# Opt level: O0

QString * __thiscall
ImportBaseFuncWrapper::getLibName(QString *__return_storage_ptr__,ImportBaseFuncWrapper *this)

{
  int iVar1;
  undefined4 extraout_var;
  char *ch;
  long *local_48;
  char *libName;
  ImportBaseEntryWrapper *p;
  ImportBaseFuncWrapper *this_local;
  
  iVar1 = (*(this->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x23])();
  if (CONCAT44(extraout_var,iVar1) == 0) {
    local_48 = (long *)0x0;
  }
  else {
    local_48 = (long *)__dynamic_cast(CONCAT44(extraout_var,iVar1),&PENodeWrapper::typeinfo,
                                      &ImportBaseEntryWrapper::typeinfo,0);
  }
  if (local_48 == (long *)0x0) {
    QString::QString(__return_storage_ptr__,"");
  }
  else {
    ch = (char *)(**(code **)(*local_48 + 0x188))();
    if (ch == (char *)0x0) {
      QString::QString(__return_storage_ptr__,"");
    }
    else {
      QString::QString(__return_storage_ptr__,ch);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString ImportBaseFuncWrapper::getLibName()
{
    ImportBaseEntryWrapper *p = dynamic_cast<ImportBaseEntryWrapper*>(this->getParentNode());
    if (!p) return "";
    
    char *libName = p->getLibraryName();
    if (!libName) return "";
    
    return QString(libName);
}